

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGsContainer.cpp
# Opt level: O1

void __thiscall CFGsContainer::processCFGs(CFGsContainer *this)

{
  _Rb_tree_header *p_Var1;
  bool indirect;
  Type TVar2;
  pointer pcVar3;
  Addr AVar4;
  _Alloc_hider _Var5;
  CFG *pCVar6;
  mapped_type *ppCVar7;
  BlockData *this_00;
  CfgNode *pCVar8;
  Instruction *instr;
  CFG *pCVar9;
  CfgNode *this_01;
  Data *data;
  int iVar10;
  string name;
  Addr addr;
  string local_68;
  map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
  *local_48;
  Addr local_40;
  CfgNode *local_38;
  
  if ((this->m_currentToken).type == TKN_BRACKET_OPEN) {
    local_48 = &this->m_cfgsMap;
    do {
      matchToken(this,TKN_BRACKET_OPEN);
      TVar2 = (this->m_currentToken).type;
      while ((uint)(TVar2 + ~TKN_ARROW) < 2) {
        if (TVar2 == TKN_NODE) {
          matchToken(this,TKN_NODE);
          local_68._M_dataplus._M_p = (pointer)(this->m_currentToken).data.addr;
          matchToken(this,TKN_ADDR);
          pCVar6 = cfg(this,(Addr)local_68._M_dataplus._M_p);
          if (pCVar6 == (CFG *)0x0) {
            __assert_fail("cfg != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFGsContainer.cpp"
                          ,0x14b,"void CFGsContainer::processCFGs()");
          }
          local_68._M_dataplus._M_p = (pointer)(this->m_currentToken).data.addr;
          matchToken(this,TKN_ADDR);
          this_00 = (BlockData *)operator_new(0x90);
          (this_00->super_Data).m_addr = (Addr)local_68._M_dataplus._M_p;
          (this_00->super_Data)._vptr_Data = (_func_int **)&PTR__BlockData_00117a58;
          this_00->m_size = 0;
          this_00->m_indirection = false;
          (this_00->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>.
          _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this_00->m_instrs;
          (this_00->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>.
          _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this_00->m_instrs;
          (this_00->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>.
          _M_impl._M_node._M_size = 0;
          p_Var1 = &(this_00->m_calls)._M_t._M_impl.super__Rb_tree_header;
          (this_00->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          (this_00->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
          ;
          (this_00->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var1->_M_header;
          (this_00->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var1->_M_header;
          (this_00->m_calls)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          p_Var1 = &(this_00->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header;
          (this_00->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
          ;
          (this_00->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          (this_00->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var1->_M_header;
          (this_00->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var1->_M_header;
          (this_00->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          pCVar8 = CFG::nodeByAddr(pCVar6,(Addr)local_68._M_dataplus._M_p);
          if (pCVar8 == (CfgNode *)0x0) {
            pCVar8 = (CfgNode *)operator_new(0x78);
            CfgNode::CfgNode(pCVar8,CFG_BLOCK);
            CfgNode::setData(pCVar8,(Data *)this_00);
            CFG::addNode(pCVar6,pCVar8);
          }
          else {
            if (pCVar8->m_type != CFG_PHANTOM) {
              __assert_fail("block->type() == CfgNode::CFG_PHANTOM",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFGsContainer.cpp"
                            ,0x153,"void CFGsContainer::processCFGs()");
            }
            CfgNode::setData(pCVar8,(Data *)this_00);
          }
          local_38 = pCVar8;
          matchToken(this,TKN_NUMBER);
          matchToken(this,TKN_BRACKET_OPEN);
          while ((this->m_currentToken).type == TKN_NUMBER) {
            AVar4 = (this->m_currentToken).data.addr;
            matchToken(this,TKN_NUMBER);
            iVar10 = (int)AVar4;
            instr = Instruction::get((Addr)local_68._M_dataplus._M_p,iVar10);
            CfgNode::BlockData::addInstruction(this_00,instr);
            local_68._M_dataplus._M_p = local_68._M_dataplus._M_p + iVar10;
          }
          matchToken(this,TKN_BRACKET_CLOSE);
          matchToken(this,TKN_BRACKET_OPEN);
          TVar2 = (this->m_currentToken).type;
          while (TVar2 == TKN_ADDR) {
            local_68._M_dataplus._M_p = (pointer)(this->m_currentToken).data.addr;
            matchToken(this,TKN_ADDR);
            if ((this->m_currentToken).type == TKN_COLON) {
              matchToken(this,TKN_COLON);
              matchToken(this,TKN_NUMBER);
            }
            _Var5._M_p = local_68._M_dataplus._M_p;
            pCVar9 = cfg(this,(Addr)local_68._M_dataplus._M_p);
            if (pCVar9 == (CFG *)0x0) {
              pCVar9 = (CFG *)operator_new(0x80);
              CFG::CFG(pCVar9,(Addr)_Var5._M_p);
              ppCVar7 = std::
                        map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
                        ::operator[](local_48,(key_type *)&local_68);
              *ppCVar7 = pCVar9;
            }
            CfgNode::BlockData::addCall(this_00,pCVar9);
            TVar2 = (this->m_currentToken).type;
          }
          matchToken(this,TKN_BRACKET_CLOSE);
          matchToken(this,TKN_BRACKET_OPEN);
          while ((this->m_currentToken).type == TKN_NUMBER) {
            iVar10 = *(int *)&(this->m_currentToken).data;
            matchToken(this,TKN_NUMBER);
            matchToken(this,TKN_ARROW);
            local_68._M_dataplus._M_p = (pointer)(this->m_currentToken).data.addr;
            matchToken(this,TKN_ADDR);
            if ((this->m_currentToken).type == TKN_COLON) {
              matchToken(this,TKN_COLON);
              matchToken(this,TKN_NUMBER);
            }
            _Var5._M_p = local_68._M_dataplus._M_p;
            pCVar9 = cfg(this,(Addr)local_68._M_dataplus._M_p);
            if (pCVar9 == (CFG *)0x0) {
              pCVar9 = (CFG *)operator_new(0x80);
              CFG::CFG(pCVar9,(Addr)_Var5._M_p);
              ppCVar7 = std::
                        map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
                        ::operator[](local_48,(key_type *)&local_68);
              *ppCVar7 = pCVar9;
            }
            CfgNode::BlockData::addSignalHandler(this_00,iVar10,pCVar9);
          }
          matchToken(this,TKN_BRACKET_CLOSE);
          indirect = (this->m_currentToken).data.boolean;
          matchToken(this,TKN_BOOL);
          CfgNode::BlockData::setIndirect(this_00,indirect);
          matchToken(this,TKN_BRACKET_OPEN);
          pCVar8 = local_38;
          TVar2 = (this->m_currentToken).type;
          while ((uint)(TVar2 + ~TKN_NODE) < 3) {
            if (TVar2 == TKN_EXIT) {
              matchToken(this,TKN_EXIT);
              this_01 = pCVar6->m_exitNode;
              if (this_01 == (CfgNode *)0x0) {
                this_01 = (CfgNode *)operator_new(0x78);
                CfgNode::CfgNode(this_01,CFG_EXIT);
                goto LAB_0010732b;
              }
            }
            else if (TVar2 == TKN_HALT) {
              matchToken(this,TKN_HALT);
              this_01 = pCVar6->m_haltNode;
              if (this_01 == (CfgNode *)0x0) {
                this_01 = (CfgNode *)operator_new(0x78);
                CfgNode::CfgNode(this_01,CFG_HALT);
                goto LAB_0010732b;
              }
            }
            else {
              if (TVar2 != TKN_ADDR) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFGsContainer.cpp"
                              ,0x1c6,"void CFGsContainer::processCFGs()");
              }
              local_68._M_dataplus._M_p = (pointer)(this->m_currentToken).data.addr;
              matchToken(this,TKN_ADDR);
              this_01 = CFG::nodeByAddr(pCVar6,(Addr)local_68._M_dataplus._M_p);
              if (this_01 == (CfgNode *)0x0) {
                data = (Data *)operator_new(0x10);
                data->m_addr = (Addr)local_68._M_dataplus._M_p;
                data->_vptr_Data = (_func_int **)&PTR__Data_00117ac0;
                this_01 = (CfgNode *)operator_new(0x78);
                CfgNode::CfgNode(this_01,CFG_PHANTOM);
                CfgNode::setData(this_01,data);
LAB_0010732b:
                CFG::addNode(pCVar6,this_01);
              }
            }
            if ((this->m_currentToken).type == TKN_COLON) {
              matchToken(this,TKN_COLON);
              matchToken(this,TKN_NUMBER);
            }
            CFG::addEdge(pCVar6,pCVar8,this_01);
            TVar2 = (this->m_currentToken).type;
          }
          matchToken(this,TKN_BRACKET_CLOSE);
        }
        else {
          if (TVar2 != TKN_CFG) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFGsContainer.cpp"
                          ,0x1d5,"void CFGsContainer::processCFGs()");
          }
          matchToken(this,TKN_CFG);
          local_40 = (this->m_currentToken).data.addr;
          matchToken(this,TKN_ADDR);
          if ((this->m_currentToken).type == TKN_COLON) {
            matchToken(this,TKN_COLON);
            matchToken(this,TKN_NUMBER);
          }
          AVar4 = local_40;
          pCVar6 = cfg(this,local_40);
          if (pCVar6 == (CFG *)0x0) {
            pCVar6 = (CFG *)operator_new(0x80);
            CFG::CFG(pCVar6,AVar4);
            ppCVar7 = std::
                      map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
                      ::operator[](local_48,&local_40);
            *ppCVar7 = pCVar6;
          }
          pcVar3 = (this->m_currentToken).token._M_dataplus._M_p;
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,pcVar3,
                     pcVar3 + (this->m_currentToken).token._M_string_length);
          matchToken(this,TKN_TEXT);
          CFG::setFunctionName(pCVar6,&local_68);
          matchToken(this,TKN_BOOL);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
        }
        TVar2 = (this->m_currentToken).type;
      }
      matchToken(this,TKN_BRACKET_CLOSE);
    } while ((this->m_currentToken).type == TKN_BRACKET_OPEN);
  }
  return;
}

Assistant:

void CFGsContainer::processCFGs() {
	while (m_currentToken.type == Lexeme::TKN_BRACKET_OPEN) {
		matchToken(Lexeme::TKN_BRACKET_OPEN);

		while (m_currentToken.type == Lexeme::TKN_CFG ||
			   m_currentToken.type == Lexeme::TKN_NODE) {
			switch (m_currentToken.type) {
				case Lexeme::TKN_CFG:
				{
					matchToken(Lexeme::TKN_CFG);

					Addr addr = m_currentToken.data.addr;
					matchToken(Lexeme::TKN_ADDR);

					if (m_currentToken.type == Lexeme::TKN_COLON) {
						matchToken(Lexeme::TKN_COLON);
						matchToken(Lexeme::TKN_NUMBER);
					}

					CFG* cfg = this->cfg(addr);
					if (!cfg) {
						cfg = new CFG(addr);
						m_cfgsMap[addr] = cfg;
					}

					std::string name = m_currentToken.token;
					matchToken(Lexeme::TKN_TEXT);
					cfg->setFunctionName(name);

					bool complete = m_currentToken.data.boolean;
					matchToken(Lexeme::TKN_BOOL);
					(void) complete;

					break;
				}
				case Lexeme::TKN_NODE:
				{
					matchToken(Lexeme::TKN_NODE);

					Addr addr = m_currentToken.data.addr;
					matchToken(Lexeme::TKN_ADDR);

					CFG* cfg = this->cfg(addr);
					assert(cfg != 0);

					addr = m_currentToken.data.addr;
					matchToken(Lexeme::TKN_ADDR);

					CfgNode::BlockData* blockData = new CfgNode::BlockData(addr);
					CfgNode* block = cfg->nodeByAddr(addr);
					if (block) {
						assert(block->type() == CfgNode::CFG_PHANTOM);
						block->setData(blockData);
					} else {
						block = new CfgNode(CfgNode::CFG_BLOCK);
						block->setData(blockData);
						cfg->addNode(block);
					}

					int block_size = m_currentToken.data.number;
					matchToken(Lexeme::TKN_NUMBER);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_NUMBER) {
						int instr_size = m_currentToken.data.number;
						matchToken(Lexeme::TKN_NUMBER);

						blockData->addInstruction(Instruction::get(addr, instr_size));
						addr += instr_size;
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					// assert((addr - blockData->addr()) == block_size);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_ADDR) {
						addr = m_currentToken.data.addr;
						matchToken(Lexeme::TKN_ADDR);

						if (m_currentToken.type == Lexeme::TKN_COLON) {
							matchToken(Lexeme::TKN_COLON);
							matchToken(Lexeme::TKN_NUMBER);
						}

						CFG* call = this->cfg(addr);
						if (!call) {
							call = new CFG(addr);
							m_cfgsMap[addr] = call;
						}

						blockData->addCall(call);
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_NUMBER) {
						int sigid = m_currentToken.data.number;
						matchToken(Lexeme::TKN_NUMBER);

						matchToken(Lexeme::TKN_ARROW);

						addr = m_currentToken.data.addr;
						matchToken(Lexeme::TKN_ADDR);

						if (m_currentToken.type == Lexeme::TKN_COLON) {
							matchToken(Lexeme::TKN_COLON);
							matchToken(Lexeme::TKN_NUMBER);
						}

						CFG* handler = this->cfg(addr);
						if (!handler) {
							handler = new CFG(addr);
							m_cfgsMap[addr] = handler;
						}

						blockData->addSignalHandler(sigid, handler);
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					bool indirection = m_currentToken.data.boolean;
					matchToken(Lexeme::TKN_BOOL);

					blockData->setIndirect(indirection);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_ADDR ||
						   m_currentToken.type == Lexeme::TKN_EXIT ||
						   m_currentToken.type == Lexeme::TKN_HALT) {
						CfgNode* succ;
						switch (m_currentToken.type) {
							case Lexeme::TKN_ADDR:
								addr = m_currentToken.data.addr;
								matchToken(Lexeme::TKN_ADDR);

								if (!(succ = cfg->nodeByAddr(addr))) {
									CfgNode::PhantomData* phantomData =
											new CfgNode::PhantomData(addr);

									succ = new CfgNode(CfgNode::CFG_PHANTOM);
									succ->setData(phantomData);

									cfg->addNode(succ);
								}

								break;
							case Lexeme::TKN_EXIT:
								matchToken(Lexeme::TKN_EXIT);

								succ = cfg->exitNode();
								if (!succ) {
									succ = new CfgNode(CfgNode::CFG_EXIT);
									cfg->addNode(succ);
								}

								break;
							case Lexeme::TKN_HALT:
								matchToken(Lexeme::TKN_HALT);

								succ = cfg->haltNode();
								if (!succ) {
									succ = new CfgNode(CfgNode::CFG_HALT);
									cfg->addNode(succ);
								}

								break;
							default:
								assert(false);
						}

						if (m_currentToken.type == Lexeme::TKN_COLON) {
							matchToken(Lexeme::TKN_COLON);
							matchToken(Lexeme::TKN_NUMBER);
						}

						cfg->addEdge(block, succ);
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					break;
				}
				default:
					assert(false);
			}
		}

		matchToken(Lexeme::TKN_BRACKET_CLOSE);
	}
}